

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::NearestNeighborsIndex::Clear(NearestNeighborsIndex *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
            (&(this->floatsamples_).super_RepeatedPtrFieldBase);
  this->numberofdimensions_ = 0;
  clear_IndexType(this);
  if ((this->_oneof_case_[1] == 200) &&
     ((this->DistanceFunction_).squaredeuclideandistance_ != (SquaredEuclideanDistance *)0x0)) {
    (*(((this->DistanceFunction_).squaredeuclideandistance_)->super_MessageLite)._vptr_MessageLite
      [1])();
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void NearestNeighborsIndex::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NearestNeighborsIndex)
  floatsamples_.Clear();
  numberofdimensions_ = 0;
  clear_IndexType();
  clear_DistanceFunction();
}